

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cc
# Opt level: O0

bool LessThan(string *left,string *right)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  string local_108 [24];
  string *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_c8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [56];
  
  bVar1 = std::operator<(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    __rhs = local_98;
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
    std::operator+(in_stack_fffffffffffffed8,__rhs);
    std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
    LogText::Log(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::operator+(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0);
    LogText::Log(in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  }
  return bVar1;
}

Assistant:

bool LessThan(const std::string& left, const std::string& right) {
  if (left < right) {
    LogText::Log("\"" + left + "\" < \"" + right + "\"");
    return true;
  } else {
    LogText::Log("\"" + left + "\" >= \"" + right + "\"");
    return false;
  }
}